

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

Type * slang::ast::builtins::PlaTask::badRange(ASTContext *context,Expression *arg)

{
  Diagnostic *diag;
  
  diag = ASTContext::addDiag(context,(DiagCode)0x1e000b,arg->sourceRange);
  ast::operator<<(diag,(arg->type).ptr);
  return ((context->scope).ptr)->compilation->errorType;
}

Assistant:

static const Type& badRange(const ASTContext& context, const Expression& arg) {
        context.addDiag(diag::PlaRangeInAscendingOrder, arg.sourceRange) << *arg.type;
        return context.getCompilation().getErrorType();
    }